

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

function<void_(Pipeline_*)> *
QUtil::file_provider(function<void_(Pipeline_*)> *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  long *plVar2;
  string *psVar3;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + filename->_M_string_length);
  plVar2 = local_48;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  psVar3 = (string *)operator_new(0x20);
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,plVar2,local_40 + (long)plVar2);
  *(string **)&(__return_storage_ptr__->super__Function_base)._M_functor = psVar3;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(Pipeline_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QUtil.cc:665:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(Pipeline_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QUtil.cc:665:12)>
       ::_M_manager;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<void(Pipeline*)>
QUtil::file_provider(std::string const& filename)
{
    return [filename](Pipeline* p) { pipe_file(filename.c_str(), p); };
}